

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3VMPrintf(sqlite3 *db,char *zFormat,__va_list_tag *ap)

{
  char *pcVar1;
  undefined1 local_98 [8];
  StrAccum acc;
  char zBase [70];
  char *z;
  __va_list_tag *ap_local;
  char *zFormat_local;
  sqlite3 *db_local;
  
  sqlite3StrAccumInit((StrAccum *)local_98,db,(char *)&acc.nChar,0x46,db->aLimit[0]);
  acc.mxAlloc._1_1_ = 1;
  sqlite3_str_vappendf((sqlite3_str *)local_98,zFormat,ap);
  pcVar1 = sqlite3StrAccumFinish((StrAccum *)local_98);
  if ((char)acc.mxAlloc == '\a') {
    sqlite3OomFault(db);
  }
  return pcVar1;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VMPrintf(sqlite3 *db, const char *zFormat, va_list ap){
  char *z;
  char zBase[SQLITE_PRINT_BUF_SIZE];
  StrAccum acc;
  assert( db!=0 );
  sqlite3StrAccumInit(&acc, db, zBase, sizeof(zBase),
                      db->aLimit[SQLITE_LIMIT_LENGTH]);
  acc.printfFlags = SQLITE_PRINTF_INTERNAL;
  sqlite3_str_vappendf(&acc, zFormat, ap);
  z = sqlite3StrAccumFinish(&acc);
  if( acc.accError==SQLITE_NOMEM ){
    sqlite3OomFault(db);
  }
  return z;
}